

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

int yaml_parser_determine_encoding(yaml_parser_t *parser)

{
  bool bVar1;
  int iVar2;
  yaml_parser_t *parser_local;
  
  while( true ) {
    bVar1 = false;
    if (parser->eof == 0) {
      bVar1 = (long)(parser->raw_buffer).last - (long)(parser->raw_buffer).pointer < 3;
    }
    if (!bVar1) break;
    iVar2 = yaml_parser_update_raw_buffer(parser);
    if (iVar2 == 0) {
      return 0;
    }
  }
  if (((long)(parser->raw_buffer).last - (long)(parser->raw_buffer).pointer < 2) ||
     (*(short *)(parser->raw_buffer).pointer != -0x101)) {
    if (((long)(parser->raw_buffer).last - (long)(parser->raw_buffer).pointer < 2) ||
       (*(short *)(parser->raw_buffer).pointer != -2)) {
      if (((long)(parser->raw_buffer).last - (long)(parser->raw_buffer).pointer < 3) ||
         (iVar2 = memcmp((parser->raw_buffer).pointer,anon_var_dwarf_3a54,3), iVar2 != 0)) {
        parser->encoding = YAML_UTF8_ENCODING;
      }
      else {
        parser->encoding = YAML_UTF8_ENCODING;
        (parser->raw_buffer).pointer = (parser->raw_buffer).pointer + 3;
        parser->offset = parser->offset + 3;
      }
    }
    else {
      parser->encoding = YAML_UTF16BE_ENCODING;
      (parser->raw_buffer).pointer = (parser->raw_buffer).pointer + 2;
      parser->offset = parser->offset + 2;
    }
  }
  else {
    parser->encoding = YAML_UTF16LE_ENCODING;
    (parser->raw_buffer).pointer = (parser->raw_buffer).pointer + 2;
    parser->offset = parser->offset + 2;
  }
  return 1;
}

Assistant:

static int
yaml_parser_determine_encoding(yaml_parser_t *parser)
{
    /* Ensure that we had enough bytes in the raw buffer. */

    while (!parser->eof
            && parser->raw_buffer.last - parser->raw_buffer.pointer < 3) {
        if (!yaml_parser_update_raw_buffer(parser)) {
            return 0;
        }
    }

    /* Determine the encoding. */

    if (parser->raw_buffer.last - parser->raw_buffer.pointer >= 2
            && !memcmp(parser->raw_buffer.pointer, BOM_UTF16LE, 2)) {
        parser->encoding = YAML_UTF16LE_ENCODING;
        parser->raw_buffer.pointer += 2;
        parser->offset += 2;
    }
    else if (parser->raw_buffer.last - parser->raw_buffer.pointer >= 2
            && !memcmp(parser->raw_buffer.pointer, BOM_UTF16BE, 2)) {
        parser->encoding = YAML_UTF16BE_ENCODING;
        parser->raw_buffer.pointer += 2;
        parser->offset += 2;
    }
    else if (parser->raw_buffer.last - parser->raw_buffer.pointer >= 3
            && !memcmp(parser->raw_buffer.pointer, BOM_UTF8, 3)) {
        parser->encoding = YAML_UTF8_ENCODING;
        parser->raw_buffer.pointer += 3;
        parser->offset += 3;
    }
    else {
        parser->encoding = YAML_UTF8_ENCODING;
    }

    return 1;
}